

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandWriteSortCnf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nQueens;
  char *__ptr;
  uint local_3c;
  
  Extra_UtilGetoptReset();
  nQueens = 4;
  local_3c = 0x10;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"NQh"), iVar1 = globalUtilOptind, iVar2 != 0x51) {
      if (iVar2 == -1) {
        if (globalUtilOptind + 1 == argc) {
          Abc_NtkWriteSorterCnf(argv[globalUtilOptind],local_3c,nQueens);
          return 0;
        }
        goto LAB_0028e18f;
      }
      if (iVar2 != 0x4e) goto LAB_0028e18f;
      if (argc <= globalUtilOptind) {
        __ptr = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_0028e17a:
        fwrite(__ptr,0x3b,1,_stdout);
        goto LAB_0028e18f;
      }
      local_3c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar1 + 1;
      if ((int)local_3c < 1) goto LAB_0028e18f;
    }
    if (argc <= globalUtilOptind) {
      __ptr = "Command line switch \"-Q\" should be followed by an integer.\n";
      goto LAB_0028e17a;
    }
    nQueens = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar1 + 1;
  } while (0 < (int)nQueens);
LAB_0028e18f:
  fwrite("usage: write_sorter_cnf [-N <num>] [-Q <num>] <file>\n",0x35,1,(FILE *)pAbc->Err);
  fwrite("\t         writes CNF for the sorter\n",0x24,1,(FILE *)pAbc->Err);
  fprintf((FILE *)pAbc->Err,"\t-N num : the number of sorter bits [default = %d]\n",(ulong)local_3c)
  ;
  fprintf((FILE *)pAbc->Err,"\t-Q num : the number of bits to be asserted to 1 [default = %d]\n",
          (ulong)nQueens);
  fwrite("\t-h     : print the help massage\n",0x21,1,(FILE *)pAbc->Err);
  fwrite("\tfile   : the name of the file to write\n",0x28,1,(FILE *)pAbc->Err);
  return 1;
}

Assistant:

int IoCommandWriteSortCnf( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pFileName;
    int c;
    int nVars = 16;
    int nQueens = 4;
    extern void Abc_NtkWriteSorterCnf( char * pFileName, int nVars, int nQueens );

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NQh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'N':
                if ( globalUtilOptind >= argc )
                {
                    fprintf( stdout, "Command line switch \"-N\" should be followed by an integer.\n" );
                    goto usage;
                }
                nVars = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nVars <= 0 ) 
                    goto usage;
                break;
            case 'Q':
                if ( globalUtilOptind >= argc )
                {
                    fprintf( stdout, "Command line switch \"-Q\" should be followed by an integer.\n" );
                    goto usage;
                }
                nQueens = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nQueens <= 0 ) 
                    goto usage;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the output file name
    pFileName = argv[globalUtilOptind];
    Abc_NtkWriteSorterCnf( pFileName, nVars, nQueens );
    // call the corresponding file writer
    return 0;

usage:
    fprintf( pAbc->Err, "usage: write_sorter_cnf [-N <num>] [-Q <num>] <file>\n" );
    fprintf( pAbc->Err, "\t         writes CNF for the sorter\n" );
    fprintf( pAbc->Err, "\t-N num : the number of sorter bits [default = %d]\n", nVars );
    fprintf( pAbc->Err, "\t-Q num : the number of bits to be asserted to 1 [default = %d]\n", nQueens );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    fprintf( pAbc->Err, "\tfile   : the name of the file to write\n" );
    return 1;
}